

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O1

void __thiscall pg::NPPSolver::~NPPSolver(NPPSolver *this)

{
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *p_Var1;
  bitset *pbVar2;
  _List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *p_Var3;
  uint *puVar4;
  uint64_t *puVar5;
  pointer pplVar6;
  pointer ppbVar7;
  pointer ppdVar8;
  uint uVar9;
  
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__NPPSolver_001a75b8;
  if (this->inverse != (int *)0x0) {
    operator_delete__(this->inverse);
  }
  p_Var1 = &(*(this->Heads).
              super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>;
  if (p_Var1 != (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(p_Var1);
    operator_delete(p_Var1,0x50);
  }
  pbVar2 = *(this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pbVar2 != (bitset *)0x0) {
    if (pbVar2->_bits != (uint64_t *)0x0) {
      operator_delete__(pbVar2->_bits);
    }
    operator_delete(pbVar2,0x20);
  }
  p_Var3 = &(*(this->Entries).
              super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ;
  if (p_Var3 != (_List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)0x0) {
    std::__cxx11::
    _List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::_M_clear(p_Var3);
    operator_delete(p_Var3,0x18);
  }
  if (this->End != 0) {
    uVar9 = 1;
    do {
      pbVar2 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar9];
      if (pbVar2 != (bitset *)0x0) {
        if (pbVar2->_bits != (uint64_t *)0x0) {
          operator_delete__(pbVar2->_bits);
        }
        operator_delete(pbVar2,0x20);
      }
      p_Var1 = &(this->Heads).
                super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar9]->
                super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>;
      if (p_Var1 != (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(p_Var1);
        operator_delete(p_Var1,0x50);
      }
      pbVar2 = (this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar9];
      if (pbVar2 != (bitset *)0x0) {
        if (pbVar2->_bits != (uint64_t *)0x0) {
          operator_delete__(pbVar2->_bits);
        }
        operator_delete(pbVar2,0x20);
      }
      p_Var3 = &(this->Entries).
                super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar9]->
                super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ;
      if (p_Var3 != (_List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)0x0) {
        std::__cxx11::
        _List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::_M_clear(p_Var3);
        operator_delete(p_Var3,0x18);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 <= this->End);
  }
  puVar4 = (this->E).queue;
  if (puVar4 != (uint *)0x0) {
    operator_delete__(puVar4);
  }
  puVar4 = (this->T).queue;
  if (puVar4 != (uint *)0x0) {
    operator_delete__(puVar4);
  }
  puVar5 = (this->O)._bits;
  if (puVar5 != (uint64_t *)0x0) {
    operator_delete__(puVar5);
  }
  puVar5 = (this->D)._bits;
  if (puVar5 != (uint64_t *)0x0) {
    operator_delete__(puVar5);
  }
  puVar5 = (this->R)._bits;
  if (puVar5 != (uint64_t *)0x0) {
    operator_delete__(puVar5);
  }
  pplVar6 = (this->Entries).
            super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pplVar6 != (pointer)0x0) {
    operator_delete(pplVar6,(long)(this->Entries).
                                  super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pplVar6
                   );
  }
  ppbVar7 = (this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppbVar7 != (pointer)0x0) {
    operator_delete(ppbVar7,(long)(this->Exits).
                                  super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppbVar7)
    ;
  }
  ppdVar8 = (this->Heads).
            super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppdVar8 != (pointer)0x0) {
    operator_delete(ppdVar8,(long)(this->Heads).
                                  super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppdVar8
                   );
  }
  ppbVar7 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppbVar7 != (pointer)0x0) {
    operator_delete(ppbVar7,(long)(this->Supgame).
                                  super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppbVar7)
    ;
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->Phase).super__Bvector_base<std::allocator<bool>_>);
  puVar5 = (this->winzero)._bits;
  if (puVar5 != (uint64_t *)0x0) {
    operator_delete__(puVar5);
  }
  puVar5 = (this->outgame)._bits;
  if (puVar5 != (uint64_t *)0x0) {
    operator_delete__(puVar5);
    return;
  }
  return;
}

Assistant:

NPPSolver::~NPPSolver()
{
    delete[] inverse;
    delete Heads[0];
    delete Exits[0];
    delete Entries[0];
    for (uint i = 1; i <= End; ++i)
    {
        delete Supgame[i];
        delete Heads[i];
        delete Exits[i];
        delete Entries[i];
    }
}